

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.h
# Opt level: O3

Regexp * re2::Regexp::LeadingRegexp(Regexp *re)

{
  Regexp *pRVar1;
  
  if (re->op_ == '\x02') {
    re = (Regexp *)0x0;
  }
  else if ((re->op_ == '\x05') && (1 < re->nsub_)) {
    pRVar1 = (Regexp *)0x0;
    if ((*(re->field_5).submany_)->op_ != '\x02') {
      pRVar1 = *(re->field_5).submany_;
    }
    return pRVar1;
  }
  return re;
}

Assistant:

RegexpOp op() { return static_cast<RegexpOp>(op_); }